

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

pointer __thiscall
slang::SmallVectorBase<slang::ast::RandCaseStatement::Item>::
emplaceRealloc<slang::ast::RandCaseStatement::Item>
          (SmallVectorBase<slang::ast::RandCaseStatement::Item> *this,pointer pos,Item *args)

{
  ulong uVar1;
  undefined8 *puVar2;
  Statement *pSVar3;
  Item *__cur_1;
  pointer pIVar4;
  pointer pIVar5;
  pointer pIVar6;
  pointer pIVar7;
  EVP_PKEY_CTX *pEVar8;
  EVP_PKEY_CTX *ctx;
  long lVar9;
  
  if (this->len == 0x7ffffffffffffff) {
    detail::throwLengthError();
  }
  pEVar8 = (EVP_PKEY_CTX *)(this->len + 1);
  uVar1 = this->cap;
  ctx = (EVP_PKEY_CTX *)(uVar1 * 2);
  if (pEVar8 < ctx) {
    pEVar8 = ctx;
  }
  if (0x7ffffffffffffff - uVar1 < uVar1) {
    pEVar8 = (EVP_PKEY_CTX *)0x7ffffffffffffff;
  }
  lVar9 = (long)pos - (long)this->data_;
  pIVar4 = (pointer)operator_new((long)pEVar8 << 4);
  pSVar3 = (args->stmt).ptr;
  *(undefined8 *)((long)pIVar4 + lVar9) = (args->expr).ptr;
  ((undefined8 *)((long)pIVar4 + lVar9))[1] = pSVar3;
  pIVar7 = this->data_;
  pIVar5 = pIVar7 + this->len;
  pIVar6 = pIVar4;
  if (pIVar5 == pos) {
    for (; pIVar7 != pos; pIVar7 = pIVar7 + 1) {
      pSVar3 = (pIVar7->stmt).ptr;
      (pIVar6->expr).ptr = (pIVar7->expr).ptr;
      (pIVar6->stmt).ptr = pSVar3;
      pIVar6 = pIVar6 + 1;
    }
  }
  else {
    for (; pIVar7 != pos; pIVar7 = pIVar7 + 1) {
      pSVar3 = (pIVar7->stmt).ptr;
      (pIVar6->expr).ptr = (pIVar7->expr).ptr;
      (pIVar6->stmt).ptr = pSVar3;
      pIVar6 = pIVar6 + 1;
    }
    puVar2 = (undefined8 *)(lVar9 + (long)pIVar4);
    for (; pos != pIVar5; pos = pos + 1) {
      pSVar3 = (pos->stmt).ptr;
      puVar2[2] = (pos->expr).ptr;
      puVar2[3] = pSVar3;
      puVar2 = puVar2 + 2;
    }
  }
  cleanup(this,ctx);
  this->len = this->len + 1;
  this->cap = (size_type)pEVar8;
  this->data_ = pIVar4;
  return (pointer)((long)pIVar4 + lVar9);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)::operator new(newCap * sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}